

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x64CVTTSD2SI(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,
                int shift)

{
  uint uVar1;
  
  if (size == sQWORD) {
    *stream = 0xf2;
    stream[1] = (8 < (int)dst) << 2 | (8 < (int)index) * '\x02' | 8 < (int)base | 0x48;
    stream[2] = '\x0f';
    stream[3] = ',';
    uVar1 = encodeAddress(stream + 4,index,multiplier,base,shift,(int)regCode[dst]);
    return (uVar1 + (int)(stream + 4)) - (int)stream;
  }
  __assert_fail("size == sQWORD",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x1c9,
                "int x64CVTTSD2SI(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)");
}

Assistant:

int x64CVTTSD2SI(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sQWORD);
	(void)size;

	*stream++ = 0xf2;
	stream += encodeRex(stream, true, dst, index, base);
	*stream++ = 0x0f;
	*stream++ = 0x2C;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}